

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void __thiscall
ON_SubDComponentId::ON_SubDComponentId
          (ON_SubDComponentId *this,uint face_id,ON__UINT_PTR face_dir,
          ON_SubDFaceCornerDex face_cdex)

{
  bool bVar1;
  uint uVar2;
  ON_SubDFaceCornerDex local_c;
  
  this->m_id = 0;
  this->m_type_and_dir = '\0';
  this->m_valueAB[0] = '\0';
  this->m_valueAB[1] = '\0';
  this->m_valueAB[2] = '\0';
  if (face_id != 0) {
    this->m_id = face_id;
    this->m_type_and_dir = face_dir != 0 | 6;
    local_c = face_cdex;
    bVar1 = ON_SubDFaceCornerDex::IsSet(&local_c);
    if (bVar1) {
      uVar2 = ON_SubDFaceCornerDex::EdgeCount(&local_c);
      if (uVar2 < 0x1000) {
        uVar2 = ON_SubDFaceCornerDex::CornerIndex(&local_c);
        if (uVar2 < 0xfff) {
          this->m_valueAB[0] = (uchar)uVar2;
          this->m_valueAB[2] = (byte)(uVar2 >> 8) | this->m_valueAB[2] & 0xf0;
        }
        uVar2 = ON_SubDFaceCornerDex::EdgeCount(&local_c);
        Internal_SetValueB(this,uVar2);
      }
    }
  }
  return;
}

Assistant:

ON_SubDComponentId::ON_SubDComponentId(unsigned face_id, ON__UINT_PTR face_dir, ON_SubDFaceCornerDex face_cdex)
{
  if (face_id > 0)
  {
    m_id = face_id;
    Internal_SetType(ON_SubDComponentPtr::Type::Face);
    Internal_SetDir(0 == face_dir ? 0u : 1u);
    if (face_cdex.IsSet() && face_cdex.EdgeCount() < 4096u)
    {
      Internal_SetValueA(face_cdex.CornerIndex());
      Internal_SetValueB(face_cdex.EdgeCount());
    }
  }
}